

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd_test.cpp
# Opt level: O0

void __thiscall Optional_Basics_Test::~Optional_Basics_Test(Optional_Basics_Test *this)

{
  void *in_RDI;
  
  ~Optional_Basics_Test((Optional_Basics_Test *)0x624778);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Optional, Basics) {
    pstd::optional<int> opt;

    EXPECT_FALSE(opt.has_value());

    opt = 1;
    EXPECT_TRUE(opt.has_value());
    EXPECT_TRUE((bool)opt);
    EXPECT_EQ(1, opt.value());
    EXPECT_EQ(1, *opt);

    opt.reset();
    EXPECT_FALSE(opt.has_value());
    EXPECT_FALSE((bool)opt);
    EXPECT_EQ(2, opt.value_or(2));
    opt = 1;
    EXPECT_EQ(1, opt.value_or(2));

    int x = 3;
    opt.reset();
    opt = std::move(x);
    EXPECT_TRUE(opt.has_value());
    EXPECT_EQ(3, opt.value());
}